

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void __thiscall diy::MemoryBuffer::swap(MemoryBuffer *this,MemoryBuffer *o)

{
  size_t sVar1;
  
  sVar1 = this->position;
  this->position = o->position;
  o->position = sVar1;
  Catch::clara::std::_Vector_base<char,_std::allocator<char>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->buffer,(_Vector_impl_data *)&o->buffer);
  sVar1 = this->blob_position;
  this->blob_position = o->blob_position;
  o->blob_position = sVar1;
  Catch::clara::std::_Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>::
  _Vector_impl_data::_M_swap_data((_Vector_impl_data *)&this->blobs,(_Vector_impl_data *)&o->blobs);
  return;
}

Assistant:

void                swap(MemoryBuffer& o)                       { std::swap(position, o.position); buffer.swap(o.buffer); std::swap(blob_position, o.blob_position); blobs.swap(o.blobs); }